

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QStaticTextPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QStaticTextPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QStaticTextPrivate *pQVar3;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QExplicitlySharedDataPointer<QStaticTextPrivate> *in_RDI;
  void *in_R8;
  QStaticTextPrivate *in_stack_00000010;
  QStaticTextPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x79a14b);
  Qt::totally_ordered_wrapper<QStaticTextPrivate_*>::operator->
            ((totally_ordered_wrapper<QStaticTextPrivate_*> *)0x79a155);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x79a15d);
  if ((!bVar1) &&
     (pQVar3 = Qt::totally_ordered_wrapper<QStaticTextPrivate_*>::get(&in_RDI->d),
     pQVar3 != (QStaticTextPrivate *)0x0)) {
    QStaticTextPrivate::~QStaticTextPrivate(in_stack_00000010);
    operator_delete(pQVar3,0xe8);
  }
  Qt::totally_ordered_wrapper<QStaticTextPrivate_*>::reset
            (&in_RDI->d,(QStaticTextPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}